

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::SccChecker::recurse(SccChecker *this,Call *c)

{
  Head *pHVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  PrgBody *n;
  PrgAtom *pPVar5;
  PrgNode PVar6;
  bool bVar7;
  head_iterator pPVar8;
  Head *pHVar9;
  head_iterator pPVar10;
  long lVar11;
  ulong uVar12;
  head_iterator pPVar13;
  PrgDisj *d;
  PrgBody *this_00;
  bool bVar14;
  
  uVar12 = c->node;
  this_00 = (PrgBody *)(uVar12 & 0xfffffffffffffffc);
  if (-1 < (long)this_00->super_PrgNode) {
    bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->nodeStack_,&c->node);
    uVar2 = this->count_;
    this->count_ = uVar2 + 1;
    c->min = uVar2;
    this_00->super_PrgNode =
         (PrgNode)((ulong)this_00->super_PrgNode & 0x30000000ffffffff |
                   (ulong)(uVar2 & 0xfffffff) << 0x20 | 0x8000000000000000);
    uVar12 = c->node;
  }
  switch((uint)uVar12 & 3) {
  case 0:
    lVar4 = *(long *)&this_00[1].field_0x8;
    uVar2 = this_00[1].headData_.sm[0].rep;
    for (lVar11 = (ulong)c->next << 2; bVar14 = (ulong)uVar2 << 2 != lVar11, bVar14;
        lVar11 = lVar11 + 4) {
      uVar3 = *(uint *)(lVar4 + lVar11);
      if ((((uVar3 & 2) == 0) &&
          (n = (this->prg_->bodies_).ebo_.buf[uVar3 >> 2], PVar6 = n->super_PrgNode,
          (PVar6._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar6 & 0x4000000080000000) == 0)) &&
         (bVar7 = onNode(this,&n->super_PrgNode,Body,c,
                         (uint32)((ulong)((lVar11 + lVar4) - *(long *)&this_00[1].field_0x8) >> 2)),
         bVar7)) {
        return bVar14;
      }
    }
    break;
  case 1:
    pHVar1 = &this_00->headData_;
    pHVar9 = pHVar1;
    if ((~*(uint *)&this_00->field_0x8 & 0x6000000) == 0) {
      pHVar9 = (Head *)(pHVar1->ext->ebo_).buf;
    }
    uVar2 = c->next;
    pPVar8 = PrgBody::heads_end(this_00);
    pPVar10 = pHVar9->sm + uVar2;
    for (pPVar13 = pPVar10; bVar14 = pPVar13 != pPVar8, bVar14; pPVar13 = pPVar13 + 1) {
      bVar7 = (pPVar13->rep & 0xc) != 0;
      pPVar5 = (&this->prg_->atoms_)[bVar7].ebo_.buf[pPVar13->rep >> 4];
      PVar6 = (pPVar5->super_PrgHead).super_PrgNode;
      if ((PVar6._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar6 & 0x4000000080000000) == 0) {
        pHVar9 = pHVar1;
        if ((~*(uint *)&this_00->field_0x8 & 0x6000000) == 0) {
          pHVar9 = (Head *)(pHVar1->ext->ebo_).buf;
        }
        bVar7 = onNode(this,(PrgNode *)pPVar5,(uint)bVar7 * 2,c,
                       (uint32)((ulong)((long)pPVar10 - (long)pHVar9) >> 2));
        if (bVar7) {
          return bVar14;
        }
      }
      pPVar10 = pPVar10 + 1;
    }
    break;
  case 2:
    uVar2 = *(uint *)&this_00[1].super_PrgNode;
    for (uVar12 = (ulong)c->next << 2; bVar14 = (uVar2 & 0x7ffffff) << 2 != uVar12, bVar14;
        uVar12 = uVar12 + 4) {
      pPVar5 = (this->prg_->atoms_).ebo_.buf
               [*(uint *)(&this_00[1].super_PrgNode.field_0x4 + uVar12)];
      PVar6 = (pPVar5->super_PrgHead).super_PrgNode;
      if (((PVar6._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar6 & 0x4000000080000000) == 0) &&
         (bVar7 = onNode(this,(PrgNode *)pPVar5,Atom,c,(uint32)(uVar12 >> 2)), bVar7)) {
        return bVar14;
      }
    }
    break;
  case 3:
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool SccChecker::recurse(Call& c) {
	PrgNode* n = unpackNode(c.node);
	if (!n->seen()) {
		nodeStack_.push_back(c.node);
		c.min = count_++;
		n->resetId(c.min, true);
	}
	if (isNode(c.node, PrgNode::Body)) {
		PrgBody* b = static_cast<PrgBody*>(n);
		PrgHead* h = 0; NodeType t;
		for (PrgBody::head_iterator it = b->heads_begin() + c.next, end = b->heads_end(); it != end; ++it) {
			if   (it->isAtom()){ h = prg_->getAtom(it->node()); t = PrgNode::Atom; }
			else               { h = prg_->getDisj(it->node()); t = PrgNode::Disj; }
			if (doVisit(h, false) && onNode(h, t, c, static_cast<uint32>(it-b->heads_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Atom)) {
		PrgAtom* a = static_cast<PrgAtom*>(n);
		for (PrgAtom::dep_iterator it = a->deps_begin() + c.next, end = a->deps_end(); it != end; ++it) {
			if (it->sign()) continue;
			PrgBody* bn = prg_->getBody(it->var());
			if (doVisit(bn, false) && onNode(bn, PrgNode::Body, c, static_cast<uint32>(it-a->deps_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Disj)) {
		PrgDisj* d = static_cast<PrgDisj*>(n);
		for (PrgDisj::atom_iterator it = d->begin() + c.next, end = d->end(); it != end; ++it) {
			PrgAtom* a = prg_->getAtom(*it);
			if (doVisit(a, false) && onNode(a, PrgNode::Atom, c, static_cast<uint32>(it-d->begin()))) {
				return true;
			}
		}
	}
	return false;
}